

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O2

vector<Quad_*,_std::allocator<Quad_*>_> * __thiscall
Rotation::transform(Rotation *this,vector<Quad_*,_std::allocator<Quad_*>_> *quads)

{
  pointer ppQVar1;
  Quad *in_RAX;
  vector<Quad*,std::allocator<Quad*>> *this_00;
  pointer ppQVar2;
  Quad *local_38;
  
  local_38 = in_RAX;
  this_00 = (vector<Quad*,std::allocator<Quad*>> *)operator_new(0x18);
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  ppQVar1 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppQVar2 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppQVar2 != ppQVar1; ppQVar2 = ppQVar2 + 1) {
    local_38 = Quad::getRotatedQuad(*ppQVar2,this->pivotPoint,this->angleRadians);
    std::vector<Quad*,std::allocator<Quad*>>::emplace_back<Quad*>(this_00,&local_38);
  }
  return (vector<Quad_*,_std::allocator<Quad_*>_> *)this_00;
}

Assistant:

vector<Quad*>* Rotation::transform(vector<Quad*>* quads) {
    vector<Quad*>* transformedQuads = new vector<Quad*>();
    for (auto quad : *quads) {
        transformedQuads->push_back(quad->getRotatedQuad(pivotPoint, angleRadians));
    }
    return transformedQuads;
}